

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

void __thiscall
fasttext::Dictionary::addSubwords
          (Dictionary *this,vector<int,_std::allocator<int>_> *line,string *token,int32_t wid)

{
  bool bVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  int32_t local_64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_64 = wid;
  if (wid < 0) {
    bVar1 = std::operator!=(token,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)EOS_abi_cxx11_);
    if (bVar1) {
      std::operator+(&local_40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     BOW_abi_cxx11_,token);
      std::operator+(&local_60,&local_40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     EOW_abi_cxx11_);
      computeSubwords(this,&local_60,line,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)0x0);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  else {
    if (0 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            maxn) {
      pvVar2 = getSubwords(this,wid);
      std::vector<int,std::allocator<int>>::
      insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
                ((vector<int,std::allocator<int>> *)line,
                 (const_iterator)
                 (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish);
      return;
    }
    std::vector<int,_std::allocator<int>_>::push_back(line,&local_64);
  }
  return;
}

Assistant:

void Dictionary::addSubwords(
		std::vector<int32_t>& line,
		const std::string& token,
		int32_t wid) const {
	if (wid < 0) { // out of vocab
		if (token != EOS) {
			computeSubwords(BOW + token + EOW, line);
		}
	} else {
		if (args_->maxn <= 0) { // in vocab w/o subwords
			line.push_back(wid);
		} else { // in vocab w/ subwords
			const std::vector<int32_t>& ngrams = getSubwords(wid);
			line.insert(line.end(), ngrams.cbegin(), ngrams.cend());
		}
	}
}